

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,char *a_pValue,char *a_pComment,bool a_bForceReplace,bool a_bCopyStrings)

{
  char *pcVar1;
  bool bVar2;
  SI_Error SVar3;
  pointer ppVar4;
  pointer ppVar5;
  int a_nOrder;
  __enable_if_t<is_constructible<value_type,_pair<const_Entry,_multimap<Entry,_const_char_*,_KeyOrder>_>_&>::value,_pair<iterator,_bool>_>
  _Var6;
  byte local_243;
  bool local_242;
  byte local_241;
  byte local_231;
  byte local_222;
  char *local_1e0;
  undefined1 local_1d8 [8];
  value_type oEntry_1;
  Entry oKey;
  _Self local_198;
  byte local_189;
  iterator iStack_188;
  bool bForceCreateNewKey;
  _Self local_180;
  char *local_178;
  char *pComment;
  int local_164;
  undefined1 local_160 [4];
  int nLoadOrder;
  _Self local_148;
  iterator iKey;
  TKeyVal *keyval;
  pair<std::_Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_bool>
  i;
  multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
  local_108;
  undefined1 local_d0 [8];
  value_type oEntry;
  Entry oSection;
  Entry local_68;
  _Self local_50;
  iterator iSection;
  bool bInserted;
  SI_Error rc;
  bool a_bCopyStrings_local;
  bool a_bForceReplace_local;
  char *a_pComment_local;
  char *a_pValue_local;
  char *a_pKey_local;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  iSection._M_node._7_1_ = 0;
  _rc = a_pComment;
  a_pComment_local = a_pValue;
  a_pValue_local = a_pKey;
  a_pKey_local = a_pSection;
  a_pSection_local = (char *)this;
  if (((!a_bCopyStrings) || (a_pComment == (char *)0x0)) ||
     (this_local._4_4_ = CopyString(this,(char **)&rc), SI_FAIL < this_local._4_4_)) {
    Entry::Entry(&local_68,a_pKey_local,0);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::find(&this->m_data,&local_68);
    oSection._16_8_ =
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::end(&this->m_data);
    bVar2 = std::operator==(&local_50,(_Self *)&oSection.nOrder);
    if (bVar2) {
      if ((a_bCopyStrings) && (SVar3 = CopyString(this,&a_pKey_local), SVar3 < SI_OK)) {
        return SVar3;
      }
      a_nOrder = this->m_nOrder + 1;
      this->m_nOrder = a_nOrder;
      Entry::Entry((Entry *)&oEntry.second._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   a_pKey_local,a_nOrder);
      if ((_rc != (char *)0x0) &&
         ((a_pValue_local == (char *)0x0 || (a_pComment_local == (char *)0x0)))) {
        oSection.pItem = _rc;
      }
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_108._M_t._M_impl._0_8_ = 0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::
      multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
      ::multimap(&local_108);
      std::
      pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
      ::
      pair<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry_&,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_true>
                ((pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
                  *)local_d0,
                 (Entry *)&oEntry.second._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_108
                );
      std::
      multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
      ::~multimap(&local_108);
      _Var6 = std::
              map<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
              ::
              insert<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>&>
                        ((map<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
                          *)&this->m_data,
                         (pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
                          *)local_d0);
      local_50._M_node = (_Base_ptr)_Var6.first._M_node;
      iSection._M_node._7_1_ = 1;
      std::
      pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
      ::~pair((pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
               *)local_d0);
    }
    if ((a_pValue_local == (char *)0x0) || (a_pComment_local == (char *)0x0)) {
      this_local._4_4_ = SI_UPDATED;
      if ((iSection._M_node._7_1_ & 1) != 0) {
        this_local._4_4_ = SI_INSERTED;
      }
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
               ::operator->(&local_50);
      iKey._M_node = (_Base_ptr)&ppVar4->second;
      Entry::Entry((Entry *)local_160,a_pValue_local,0);
      local_148._M_node =
           (_Base_ptr)
           std::
           multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
           ::find(&ppVar4->second,(key_type *)local_160);
      local_164 = this->m_nOrder + 1;
      this->m_nOrder = local_164;
      pComment = (char *)std::
                         multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                         ::end((multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                                *)iKey._M_node);
      bVar2 = std::operator!=(&local_148,(_Self *)&pComment);
      local_222 = 0;
      if ((bVar2) && (local_222 = 0, (this->m_bAllowMultiKey & 1U) != 0)) {
        local_222 = a_bForceReplace;
      }
      if ((local_222 & 1) != 0) {
        local_178 = (char *)0x0;
        while( true ) {
          local_180._M_node =
               (_Base_ptr)
               std::
               multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
               ::end(iKey._M_node);
          bVar2 = std::operator!=(&local_148,&local_180);
          pcVar1 = a_pValue_local;
          local_231 = 0;
          if (bVar2) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&local_148);
            bVar2 = IsLess(this,pcVar1,(ppVar5->first).pItem);
            local_231 = bVar2 ^ 0xff;
          }
          if ((local_231 & 1) == 0) break;
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                   ::operator->(&local_148);
          if ((ppVar5->first).nOrder < local_164) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&local_148);
            local_164 = (ppVar5->first).nOrder;
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&local_148);
            local_178 = (ppVar5->first).pComment;
          }
          std::
          _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
          ::operator++(&local_148);
        }
        if (local_178 != (char *)0x0) {
          DeleteString(this,_rc);
          _rc = local_178;
          CopyString(this,(char **)&rc);
        }
        Delete(this,a_pKey_local,a_pValue_local,false);
        iStack_188 = std::
                     multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                     ::end(iKey._M_node);
        local_148._M_node = iStack_188._M_node;
      }
      local_241 = 0;
      if ((this->m_bAllowMultiKey & 1U) != 0) {
        local_241 = a_bForceReplace ^ 0xff;
      }
      local_189 = local_241 & 1;
      if (a_bCopyStrings) {
        local_242 = true;
        if (local_189 == 0) {
          local_198._M_node =
               (_Base_ptr)
               std::
               multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
               ::end(iKey._M_node);
          local_242 = std::operator==(&local_148,&local_198);
        }
        if ((local_242 != false) && (SVar3 = CopyString(this,&a_pValue_local), SVar3 < SI_OK)) {
          return SVar3;
        }
        SVar3 = CopyString(this,&a_pComment_local);
        if (SVar3 < SI_OK) {
          return SVar3;
        }
      }
      oKey._16_8_ = std::
                    multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                    ::end((multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                           *)iKey._M_node);
      bVar2 = std::operator==(&local_148,(_Self *)&oKey.nOrder);
      local_243 = 1;
      if (!bVar2) {
        local_243 = local_189;
      }
      if ((local_243 & 1) != 0) {
        Entry::Entry((Entry *)&oEntry_1.second,a_pValue_local,local_164);
        if (_rc != (char *)0x0) {
          oKey.pItem = _rc;
        }
        local_1e0 = (char *)0x0;
        std::
        pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>
        ::
        pair<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry_&,_const_char_*,_true>
                  ((pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>
                    *)local_1d8,(Entry *)&oEntry_1.second,&local_1e0);
        local_148._M_node =
             (_Base_ptr)
             std::
             multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
             ::
             insert<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>&>
                       (iKey._M_node,
                        (pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>
                         *)local_1d8);
        iSection._M_node._7_1_ = 1;
      }
      pcVar1 = a_pComment_local;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
               ::operator->(&local_148);
      ppVar5->second = pcVar1;
      this_local._4_4_ = SI_UPDATED;
      if ((iSection._M_node._7_1_ & 1) != 0) {
        this_local._4_4_ = SI_INSERTED;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::AddEntry(const SI_CHAR *a_pSection, const SI_CHAR *a_pKey,
																	  const SI_CHAR *a_pValue,
																	  const SI_CHAR *a_pComment, bool a_bForceReplace,
																	  bool a_bCopyStrings) {
	SI_Error rc;
	bool bInserted = false;

	SI_ASSERT(!a_pComment || IsComment(*a_pComment));

	// if we are copying strings then make a copy of the comment now
	// because we will need it when we add the entry.
	if (a_bCopyStrings && a_pComment) {
		rc = CopyString(a_pComment);
		if (rc < 0) return rc;
	}

	// create the section entry if necessary
	typename TSection::iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		// if the section doesn't exist then we need a copy as the
		// string needs to last beyond the end of this function
		if (a_bCopyStrings) {
			rc = CopyString(a_pSection);
			if (rc < 0) return rc;
		}

		// only set the comment if this is a section only entry
		Entry oSection(a_pSection, ++m_nOrder);
		if (a_pComment && (!a_pKey || !a_pValue)) {
			oSection.pComment = a_pComment;
		}

		typename TSection::value_type oEntry(oSection, TKeyVal());
		typedef typename TSection::iterator SectionIterator;
		std::pair<SectionIterator, bool> i = m_data.insert(oEntry);
		iSection = i.first;
		bInserted = true;
	}
	if (!a_pKey || !a_pValue) {
		// section only entries are specified with pItem and pVal as NULL
		return bInserted ? SI_INSERTED : SI_UPDATED;
	}

	// check for existence of the key
	TKeyVal &keyval = iSection->second;
	typename TKeyVal::iterator iKey = keyval.find(a_pKey);

	// remove all existing entries but save the load order and
	// comment of the first entry
	int nLoadOrder = ++m_nOrder;
	if (iKey != keyval.end() && m_bAllowMultiKey && a_bForceReplace) {
		const SI_CHAR *pComment = NULL;
		while (iKey != keyval.end() && !IsLess(a_pKey, iKey->first.pItem)) {
			if (iKey->first.nOrder < nLoadOrder) {
				nLoadOrder = iKey->first.nOrder;
				pComment = iKey->first.pComment;
			}
			++iKey;
		}
		if (pComment) {
			DeleteString(a_pComment);
			a_pComment = pComment;
			(void)CopyString(a_pComment);
		}
		Delete(a_pSection, a_pKey);
		iKey = keyval.end();
	}

	// make string copies if necessary
	bool bForceCreateNewKey = m_bAllowMultiKey && !a_bForceReplace;
	if (a_bCopyStrings) {
		if (bForceCreateNewKey || iKey == keyval.end()) {
			// if the key doesn't exist then we need a copy as the
			// string needs to last beyond the end of this function
			// because we will be inserting the key next
			rc = CopyString(a_pKey);
			if (rc < 0) return rc;
		}

		// we always need a copy of the value
		rc = CopyString(a_pValue);
		if (rc < 0) return rc;
	}

	// create the key entry
	if (iKey == keyval.end() || bForceCreateNewKey) {
		Entry oKey(a_pKey, nLoadOrder);
		if (a_pComment) {
			oKey.pComment = a_pComment;
		}
		typename TKeyVal::value_type oEntry(oKey, static_cast<const SI_CHAR *>(NULL));
		iKey = keyval.insert(oEntry);
		bInserted = true;
	}
	iKey->second = a_pValue;
	return bInserted ? SI_INSERTED : SI_UPDATED;
}